

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

ProgressData * __thiscall
duckdb::IEJoinGlobalSourceState::GetProgress
          (ProgressData *__return_storage_ptr__,IEJoinGlobalSourceState *this)

{
  __int_type _Var1;
  __int_type _Var2;
  ulong uVar3;
  ulong uVar4;
  __int_type _Var5;
  reference pvVar6;
  type this_00;
  type this_01;
  idx_t iVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  
  pvVar6 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::get<true>(&this->gsink->tables,0);
  this_00 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
            ::operator*(pvVar6);
  pvVar6 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::get<true>(&this->gsink->tables,1);
  this_01 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
            ::operator*(pvVar6);
  iVar7 = PhysicalRangeJoin::GlobalSortedTable::BlockCount(this_00);
  iVar8 = PhysicalRangeJoin::GlobalSortedTable::BlockCount(this_01);
  _Var1 = (this->left_outers).super___atomic_base<unsigned_long>._M_i;
  _Var2 = (this->right_outers).super___atomic_base<unsigned_long>._M_i;
  uVar3 = (this->next_left).super___atomic_base<unsigned_long>._M_i;
  uVar10 = (this->left_outers).super___atomic_base<unsigned_long>._M_i;
  uVar4 = (this->next_right).super___atomic_base<unsigned_long>._M_i;
  uVar11 = (this->right_outers).super___atomic_base<unsigned_long>._M_i;
  _Var5 = (this->completed).super___atomic_base<unsigned_long>._M_i;
  __return_storage_ptr__->invalid = false;
  uVar9 = _Var2 + _Var1 + iVar8 * iVar7;
  if (uVar9 == 0) {
    __return_storage_ptr__->invalid = true;
    dVar12 = 0.0;
    dVar13 = 1.0;
  }
  else {
    if (uVar4 < uVar11) {
      uVar11 = uVar4;
    }
    if (uVar3 < uVar10) {
      uVar10 = uVar3;
    }
    uVar11 = _Var5 + uVar10 + uVar11;
    dVar12 = ((double)(uVar11 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar11 & 0xffffffff | 0x4330000000000000);
    dVar13 = ((double)(uVar9 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar9 & 0xffffffff | 0x4330000000000000);
  }
  __return_storage_ptr__->done = dVar12;
  __return_storage_ptr__->total = dVar13;
  return __return_storage_ptr__;
}

Assistant:

ProgressData GetProgress() const {
		auto &left_table = *gsink.tables[0];
		auto &right_table = *gsink.tables[1];

		const auto left_blocks = left_table.BlockCount();
		const auto right_blocks = right_table.BlockCount();
		const auto pair_count = left_blocks * right_blocks;

		const auto count = pair_count + left_outers + right_outers;

		const auto l = MinValue(next_left.load(), left_outers.load());
		const auto r = MinValue(next_right.load(), right_outers.load());
		const auto returned = completed.load() + l + r;

		ProgressData res;
		if (count) {
			res.done = double(returned);
			res.total = double(count);
		} else {
			res.SetInvalid();
		}
		return res;
	}